

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestcompareDouble::runTestCase(TestValueTestcompareDouble *this)

{
  TestResult *pTVar1;
  ValueTest *in_RDI;
  PredicateContext _minitest_Context_3;
  PredicateContext _minitest_Context_2;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  double in_stack_fffffffffffffdc8;
  Value *in_stack_fffffffffffffdd0;
  Value *this_00;
  Value *in_stack_fffffffffffffdd8;
  Value *x;
  Value *in_stack_fffffffffffffe00;
  PredicateContext local_1c8 [2];
  PredicateContext local_148 [2];
  PredicateContext local_c8 [3];
  PredicateContext local_38;
  
  local_38.id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_38.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_38.line_ = 0x531;
  local_38.expr_ = "checkIsLess(0.0, 10.0)";
  local_38.next_ = (PredicateContext *)0x0;
  local_38.failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = &local_38;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = &local_38;
  Json::Value::Value(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Json::Value::Value(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  ValueTest::checkIsLess(in_RDI,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  Json::Value::~Value(in_stack_fffffffffffffe00);
  Json::Value::~Value(in_stack_fffffffffffffe00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_c8[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_c8[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_c8[0].line_ = 0x532;
  local_c8[0].expr_ = "checkIsEqual(10.0, 10.0)";
  local_c8[0].next_ = (PredicateContext *)0x0;
  local_c8[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_c8;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_c8;
  x = (Value *)0x4024000000000000;
  Json::Value::Value(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Json::Value::Value(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  ValueTest::checkIsEqual(in_RDI,x,in_stack_fffffffffffffdd0);
  Json::Value::~Value(in_stack_fffffffffffffe00);
  Json::Value::~Value(in_stack_fffffffffffffe00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_148[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_148[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_148[0].line_ = 0x533;
  local_148[0].expr_ = "checkIsEqual(-10.0, -10.0)";
  local_148[0].next_ = (PredicateContext *)0x0;
  local_148[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_148;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_148;
  this_00 = (Value *)0xc024000000000000;
  Json::Value::Value((Value *)0xc024000000000000,in_stack_fffffffffffffdc8);
  Json::Value::Value(this_00,in_stack_fffffffffffffdc8);
  ValueTest::checkIsEqual(in_RDI,x,this_00);
  Json::Value::~Value(in_stack_fffffffffffffe00);
  Json::Value::~Value(in_stack_fffffffffffffe00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_1c8[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_1c8[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1c8[0].line_ = 0x534;
  local_1c8[0].expr_ = "checkIsLess(-10.0, 0.0)";
  local_1c8[0].next_ = (PredicateContext *)0x0;
  local_1c8[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_1c8;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_1c8;
  Json::Value::Value(this_00,in_stack_fffffffffffffdc8);
  Json::Value::Value(this_00,in_stack_fffffffffffffdc8);
  ValueTest::checkIsLess(in_RDI,x,this_00);
  Json::Value::~Value(in_stack_fffffffffffffe00);
  Json::Value::~Value(in_stack_fffffffffffffe00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareDouble) {
  JSONTEST_ASSERT_PRED(checkIsLess(0.0, 10.0));
  JSONTEST_ASSERT_PRED(checkIsEqual(10.0, 10.0));
  JSONTEST_ASSERT_PRED(checkIsEqual(-10.0, -10.0));
  JSONTEST_ASSERT_PRED(checkIsLess(-10.0, 0.0));
}